

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_perform_capability(Curl_easy *data,connectdata *conn)

{
  byte *pbVar1;
  CURLcode CVar2;
  
  *(undefined2 *)((long)&conn->proto + 0xb8) = 0;
  *(undefined2 *)((long)&conn->proto + 0xbc) = 0;
  pbVar1 = (byte *)((long)&conn->proto + 0xfb);
  *pbVar1 = *pbVar1 & 0xfb;
  CVar2 = imap_sendf(data,"CAPABILITY");
  if (CVar2 == CURLE_OK) {
    (data->conn->proto).imapc.state = IMAP_CAPABILITY;
  }
  return CVar2;
}

Assistant:

static CURLcode imap_perform_capability(struct Curl_easy *data,
                                        struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  imapc->sasl.authmechs = SASL_AUTH_NONE; /* No known auth. mechanisms yet */
  imapc->sasl.authused = SASL_AUTH_NONE;  /* Clear the auth. mechanism used */
  imapc->tls_supported = FALSE;           /* Clear the TLS capability */

  /* Send the CAPABILITY command */
  result = imap_sendf(data, "CAPABILITY");

  if(!result)
    imap_state(data, IMAP_CAPABILITY);

  return result;
}